

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

djg_mesh * djgm_load_cylinder(int slices,int stacks)

{
  float fVar1;
  float fVar2;
  djg_mesh *pdVar3;
  djgm_vertex *pdVar4;
  double dVar5;
  float z;
  float phi;
  djgm_vertex *v;
  int j;
  int i;
  djg_mesh *mesh;
  int stacks_local;
  int slices_local;
  
  pdVar3 = djgm_load_plane(slices,stacks);
  for (v._4_4_ = 0; v._4_4_ < slices + 2; v._4_4_ = v._4_4_ + 1) {
    for (v._0_4_ = 0; (int)v < stacks + 2; v._0_4_ = (int)v + 1) {
      pdVar4 = pdVar3->vertexv + (v._4_4_ * (stacks + 2) + (int)v);
      fVar2 = (pdVar4->st).s * 2.0 * 3.1415927;
      fVar1 = (pdVar4->st).t;
      dVar5 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->p).x = SUB84(dVar5,0);
      dVar5 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->p).y = SUB84(dVar5,0);
      (pdVar4->p).z = fVar1 + fVar1 + -1.0;
      dVar5 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->dpds).x = -SUB84(dVar5,0);
      dVar5 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->dpds).y = SUB84(dVar5,0);
      (pdVar4->dpds).z = 0.0;
      (pdVar4->dpdt).x = 0.0;
      (pdVar4->dpdt).y = 0.0;
      (pdVar4->dpdt).z = 1.0;
    }
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_cylinder(int slices, int stacks)
{
    djg_mesh *mesh = djgm_load_plane(slices, stacks);;
    int i, j;

    slices+= 2;
    stacks+= 2;

    for (i = 0; i < slices; ++i)
    for (j = 0; j < stacks; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * stacks + j];
        float phi = v->st.s * 2 * M_PI;
        float z = 2 * v->st.t - 1;

        v->p.x = cos(phi);
        v->p.y = sin(phi);
        v->p.z = z;

        v->dpds.x = -sin(phi);
        v->dpds.y = +cos(phi);
        v->dpds.z = 0;

        v->dpdt.x = 0;
        v->dpdt.y = 0;
        v->dpdt.z = 1;
    }

    return mesh;
}